

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publish(Publication *this,double val,string *units)

{
  string_view message;
  __type_conflict _Var1;
  bool bVar2;
  double val_00;
  undefined8 uVar3;
  Publication *in_RDI;
  precise_unit pVar4;
  double in_stack_00000018;
  Publication *in_stack_00000020;
  precise_unit punit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI,in_stack_ffffffffffffff88);
  if (_Var1) {
    publish(in_stack_00000020,in_stack_00000018);
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  val_00 = (double)::units::getDefaultFlags();
  pVar4 = ::units::unit_from_string(in_stack_ffffffffffffffb0,(uint64_t)in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(in_stack_ffffffffffffff70);
  bVar2 = ::units::is_valid((precise_unit *)pVar4.multiplier_);
  if (bVar2) {
    publish(in_RDI,val_00,(precise_unit *)pVar4.multiplier_);
    return;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)pVar4.multiplier_,pVar4._8_8_);
  message._M_str = (char *)in_RDI;
  message._M_len = (size_t)val_00;
  InvalidConversion::InvalidConversion((InvalidConversion *)pVar4.multiplier_,message);
  __cxa_throw(uVar3,&InvalidConversion::typeinfo,InvalidConversion::~InvalidConversion);
}

Assistant:

void Publication::publish(double val, const std::string& units)
{
    if (units == pubUnits) {
        publish(val);
    }
    auto punit = units::unit_from_string(units);
    if (units::is_valid(punit)) {
        publish(val, punit);
    } else {
        throw(InvalidConversion{});
    }
}